

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_version.c
# Opt level: O0

SUNErrCode SUNDIALSGetVersionNumber(int *major,int *minor,int *patch,char *label,int len)

{
  char *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_RDI;
  int in_R8D;
  SUNErrCode local_4;
  
  if ((((in_RDI == (undefined4 *)0x0) || (in_RSI == (undefined4 *)0x0)) ||
      (in_RDX == (undefined4 *)0x0)) || (in_RCX == (char *)0x0)) {
    local_4 = -9999;
  }
  else if (in_R8D == 0) {
    local_4 = -0x270d;
  }
  else {
    *in_RDI = 7;
    *in_RSI = 1;
    *in_RDX = 0;
    strncpy(in_RCX,"",(long)in_R8D);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNDIALSGetVersionNumber(int* major, int* minor, int* patch,
                                    char* label, int len)
{
  if (major == NULL || minor == NULL || patch == NULL || label == NULL)
  {
    return SUN_ERR_ARG_CORRUPT;
  }
  if (strlen(SUNDIALS_VERSION_LABEL) >= (size_t)len)
  {
    return SUN_ERR_ARG_OUTOFRANGE;
  }

  *major = SUNDIALS_VERSION_MAJOR;
  *minor = SUNDIALS_VERSION_MINOR;
  *patch = SUNDIALS_VERSION_PATCH;
  strncpy(label, SUNDIALS_VERSION_LABEL, (size_t)len);

  return SUN_SUCCESS;
}